

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.hpp
# Opt level: O0

void __thiscall
Inferences::ALASCA::VariableElimination::
FoundVariable<Kernel::NumTraits<Kernel::IntegerConstantType>_>::FoundVariable
          (FoundVariable<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,
          Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
          *var)

{
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  *in_RSI;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  *in_RDI;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
  *this_00;
  
  Lib::
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  ::Perfect(in_RDI,in_RSI);
  this_00 = (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
             *)0x0;
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
  ::Stack((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
           *)0x0,(size_t)in_RDI);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
  ::Stack(this_00,(size_t)in_RDI);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
  ::Stack(this_00,(size_t)in_RDI);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
  ::Stack(this_00,(size_t)in_RDI);
  return;
}

Assistant:

FoundVariable(Perfect<MonomFactors<NumTraits>> var) : var(var), posIneq(), negIneq(), eq(), neq() {}